

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

void am_check_start_obj_parameters
               (Am_Object *in_cmd,Am_Value_List *placeholder_list,
               Am_Value_List *created_objects_assoc,int *cnt)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Wrapper *value;
  Am_Am_Slot_Key local_7a;
  undefined1 local_78 [8];
  Am_Value v;
  undefined1 local_60 [6];
  Am_Slot_Key slot;
  Am_Value_List slots_modified;
  Am_Value_List slots_to_save;
  Am_Object local_30;
  Am_Object start_object;
  int *cnt_local;
  Am_Value_List *created_objects_assoc_local;
  Am_Value_List *placeholder_list_local;
  Am_Object *in_cmd_local;
  
  start_object.data = (Am_Object_Data *)cnt;
  pAVar2 = Am_Object::Get(in_cmd,0x11a,0);
  Am_Object::Am_Object(&local_30,pAVar2);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_30,0xb8,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)&slots_modified.item,pAVar2);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_60);
    Am_Value::Am_Value((Am_Value *)local_78);
    Am_Value_List::Start((Am_Value_List *)&slots_modified.item);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)&slots_modified.item),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar2 = Am_Value_List::Get((Am_Value_List *)&slots_modified.item);
      Am_Am_Slot_Key::Am_Am_Slot_Key(&local_7a,pAVar2);
      v.value.long_value._6_2_ = Am_Am_Slot_Key::operator_cast_to_unsigned_short(&local_7a);
      pAVar2 = Am_Object::Peek(&local_30,v.value.long_value._6_2_,0);
      Am_Value::operator=((Am_Value *)local_78,pAVar2);
      bVar1 = Am_Value::Valid((Am_Value *)local_78);
      if ((bVar1) && (local_78._0_2_ == 0xa001)) {
        if ((am_sdebug & 1U) != 0) {
          poVar3 = std::operator<<((ostream *)&std::cout,"checking slot ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,v.value.long_value._6_2_);
          poVar3 = std::operator<<(poVar3," oldval ");
          poVar3 = operator<<(poVar3,(Am_Value *)local_78);
          this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
        }
        bVar1 = check_one_obj_modified
                          ((Am_Value *)local_78,v.value.long_value._6_2_,in_cmd,placeholder_list,
                           created_objects_assoc,(int *)start_object.data);
        if (bVar1) {
          Am_Value_List::Add((Am_Value_List *)local_60,(uint)(ushort)v.value.long_value._6_2_,
                             Am_TAIL,true);
        }
      }
      Am_Value_List::Next((Am_Value_List *)&slots_modified.item);
    }
    bVar1 = Am_Value_List::Valid((Am_Value_List *)local_60);
    if (bVar1) {
      value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_60);
      Am_Object::Set(in_cmd,0xb8,value,1);
    }
    Am_Value::~Am_Value((Am_Value *)local_78);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_60);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&slots_modified.item);
  }
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

void
am_check_start_obj_parameters(Am_Object &in_cmd,
                              Am_Value_List &placeholder_list,
                              Am_Value_List &created_objects_assoc, int &cnt)
{
  Am_Object start_object = in_cmd.Get(Am_START_OBJECT);
  if (start_object.Valid()) {
    Am_Value_List slots_to_save = start_object.Get(Am_SLOTS_TO_SAVE);
    Am_Value_List slots_modified;
    Am_Slot_Key slot;
    Am_Value v;
    for (slots_to_save.Start(); !slots_to_save.Last(); slots_to_save.Next()) {
      slot = (Am_Am_Slot_Key)slots_to_save.Get();
      v = start_object.Peek(slot);
      // **** should probably also check for lists of objects
      if (v.Valid() && v.type == Am_OBJECT) {
        if (am_sdebug)
          std::cout << "checking slot " << slot << " oldval " << v << std::endl
                    << std::flush;
        if (check_one_obj_modified(v, slot, in_cmd, placeholder_list,
                                   created_objects_assoc, cnt))
          slots_modified.Add(slot);
      }
    }
    if (slots_modified.Valid()) {
      in_cmd.Set(Am_SLOTS_TO_SAVE, slots_modified, Am_OK_IF_NOT_THERE);
    }
  }
}